

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapS.c
# Opt level: O0

Fxu_HeapSingle * Fxu_HeapSingleStart(void)

{
  Fxu_HeapSingle *__s;
  Fxu_Single **ppFVar1;
  Fxu_HeapSingle *p;
  
  __s = (Fxu_HeapSingle *)malloc(0x18);
  memset(__s,0,0x18);
  __s->nItems = 0;
  __s->nItemsAlloc = 2000;
  ppFVar1 = (Fxu_Single **)malloc((long)(__s->nItemsAlloc + 10) << 3);
  __s->pTree = ppFVar1;
  *__s->pTree = (Fxu_Single *)0x0;
  return __s;
}

Assistant:

Fxu_HeapSingle * Fxu_HeapSingleStart()
{
	Fxu_HeapSingle * p;
	p = ABC_ALLOC( Fxu_HeapSingle, 1 );
	memset( p, 0, sizeof(Fxu_HeapSingle) );
	p->nItems      = 0;
	p->nItemsAlloc = 2000;
	p->pTree       = ABC_ALLOC( Fxu_Single *, p->nItemsAlloc + 10 );
	p->pTree[0]    = NULL;
	return p;
}